

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int IFN_Previous_Word(FORM *form)

{
  FIELD *pFVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcStack_30;
  _Bool again;
  char *t;
  char *s;
  char *bp;
  FIELD *field;
  FORM *form_local;
  
  pFVar1 = form->current;
  pcVar2 = form->current->buf + (long)form->curcol + (long)(form->currow * form->current->dcols);
  Synchronize_Buffer(form);
  pcVar3 = After_End_Of_Data(pFVar1->buf,(int)pcVar2 - (int)pFVar1->buf);
  pcStack_30 = After_Last_Whitespace_Character(pFVar1->buf,(int)pcVar3 - (int)pFVar1->buf);
  if (pcVar3 == pcVar2) {
    pcVar2 = After_End_Of_Data(pFVar1->buf,(int)pcStack_30 - (int)pFVar1->buf);
    pcStack_30 = After_Last_Whitespace_Character(pFVar1->buf,(int)pcVar2 - (int)pFVar1->buf);
  }
  Adjust_Cursor_Position(form,pcStack_30);
  return 0;
}

Assistant:

static int IFN_Previous_Word(FORM * form)
{
  FIELD *field = form->current;
  char  *bp    = Address_Of_Current_Position_In_Buffer(form);
  char  *s;
  char  *t;
  bool  again = FALSE;

  /* We really need access to the data, so we have to synchronize */
  Synchronize_Buffer(form);

  s = After_End_Of_Data(field->buf,(int)(bp-field->buf));
  /* s points now right after the last non-blank in the buffer before bp.
     If bp was in a word, s equals bp. In this case we must find the last
     whitespace in the buffer before bp and repeat the game to really find
     the previous word! */
  if (s==bp)
    again = TRUE;
  
  /* And next call now goes backward to look for the last whitespace
     before that, pointing right after this, so it points to the begin
     of the previous word. 
  */
  t = After_Last_Whitespace_Character(field->buf,(int)(s - field->buf));
#if !FRIENDLY_PREV_NEXT_WORD
  if (s==t) 
    return(E_REQUEST_DENIED);
#endif
  if (again)
    { /* and do it again, replacing bp by t */
      s = After_End_Of_Data(field->buf,(int)(t - field->buf));
      t = After_Last_Whitespace_Character(field->buf,(int)(s - field->buf));
#if !FRIENDLY_PREV_NEXT_WORD
      if (s==t) 
        return(E_REQUEST_DENIED);
#endif
    }
  Adjust_Cursor_Position(form,t);
  return(E_OK);
}